

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

void xmlRelaxNGDumpValidError(xmlRelaxNGValidCtxtPtr ctxt)

{
  xmlRelaxNGValidErrorPtr pxVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  xmlRelaxNGValidErrorPtr pxVar5;
  long lVar6;
  long lVar7;
  
  lVar6 = 0;
  lVar4 = 0;
  iVar3 = 0;
  do {
    if (ctxt->errNr <= lVar4) {
      ctxt->errNr = 0;
      return;
    }
    pxVar5 = ctxt->errTab + lVar4;
    if (iVar3 < 5) {
      for (lVar7 = 0; lVar6 != lVar7; lVar7 = lVar7 + 0x28) {
        pxVar1 = ctxt->errTab;
        if ((((pxVar5->err == *(xmlRelaxNGValidErr *)((long)&pxVar1->err + lVar7)) &&
             (pxVar5->node == *(xmlNodePtr *)((long)&pxVar1->node + lVar7))) &&
            (iVar2 = xmlStrEqual(pxVar5->arg1,*(xmlChar **)((long)&pxVar1->arg1 + lVar7)),
            iVar2 != 0)) &&
           (iVar2 = xmlStrEqual(pxVar5->arg2,*(xmlChar **)((long)&pxVar1->arg2 + lVar7)), iVar2 != 0
           )) goto LAB_0017fde3;
      }
      xmlRelaxNGShowValidError(ctxt,pxVar5->err,pxVar5->node,pxVar5->seq,pxVar5->arg1,pxVar5->arg2);
      iVar3 = iVar3 + 1;
    }
LAB_0017fde3:
    if ((pxVar5->flags & 1) != 0) {
      if (pxVar5->arg1 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar5->arg1);
      }
      pxVar5->arg1 = (xmlChar *)0x0;
      if (pxVar5->arg2 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar5->arg2);
      }
      pxVar5->arg2 = (xmlChar *)0x0;
      pxVar5->flags = 0;
    }
    lVar4 = lVar4 + 1;
    lVar6 = lVar6 + 0x28;
  } while( true );
}

Assistant:

static void
xmlRelaxNGDumpValidError(xmlRelaxNGValidCtxtPtr ctxt)
{
    int i, j, k;
    xmlRelaxNGValidErrorPtr err, dup;

    for (i = 0, k = 0; i < ctxt->errNr; i++) {
        err = &ctxt->errTab[i];
        if (k < MAX_ERROR) {
            for (j = 0; j < i; j++) {
                dup = &ctxt->errTab[j];
                if ((err->err == dup->err) && (err->node == dup->node) &&
                    (xmlStrEqual(err->arg1, dup->arg1)) &&
                    (xmlStrEqual(err->arg2, dup->arg2))) {
                    goto skip;
                }
            }
            xmlRelaxNGShowValidError(ctxt, err->err, err->node, err->seq,
                                     err->arg1, err->arg2);
            k++;
        }
      skip:
        if (err->flags & ERROR_IS_DUP) {
            if (err->arg1 != NULL)
                xmlFree((xmlChar *) err->arg1);
            err->arg1 = NULL;
            if (err->arg2 != NULL)
                xmlFree((xmlChar *) err->arg2);
            err->arg2 = NULL;
            err->flags = 0;
        }
    }
    ctxt->errNr = 0;
}